

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O0

int explist1(LexState *ls,expdesc *v)

{
  int iVar1;
  int local_1c;
  int n;
  expdesc *v_local;
  LexState *ls_local;
  
  local_1c = 1;
  expr(ls,v);
  while( true ) {
    iVar1 = testnext(ls,0x2c);
    if (iVar1 == 0) break;
    luaK_exp2nextreg(ls->fs,v);
    expr(ls,v);
    local_1c = local_1c + 1;
  }
  return local_1c;
}

Assistant:

static int explist1 (LexState *ls, expdesc *v) {
  /* explist1 -> expr { `,' expr } */
  int n = 1;  /* at least one expression */
  expr(ls, v);
  while (testnext(ls, ',')) {
    luaK_exp2nextreg(ls->fs, v);
    expr(ls, v);
    n++;
  }
  return n;
}